

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglshaderprogram.h
# Opt level: O3

void __thiscall
rengine::OpenGLShaderProgram::initialize
          (OpenGLShaderProgram *this,char *vsh,char *fsh,
          vector<const_char_*,_std::allocator<const_char_*>_> *attrs)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  int iVar4;
  pointer ppcVar5;
  char *__ptr;
  ostream *poVar6;
  ulong uVar7;
  char *local_68;
  long local_60;
  int local_44;
  char *pcStack_40;
  int l;
  int local_34 [2];
  int param;
  
  if (this->m_id != 0) {
    __assert_fail("m_id == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglshaderprogram.h"
                  ,0x3d,
                  "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
                 );
  }
  GVar1 = createShader(this,vsh,0x8b31);
  pcStack_40 = fsh;
  GVar2 = createShader(this,fsh,0x8b30);
  if (GVar1 == 0) {
    __assert_fail("vid",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglshaderprogram.h"
                  ,0x41,
                  "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
                 );
  }
  if (GVar2 == 0) {
    __assert_fail("fid",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglshaderprogram.h"
                  ,0x42,
                  "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
                 );
  }
  GVar3 = glCreateProgram();
  this->m_id = GVar3;
  glAttachShader(GVar3,GVar1);
  glAttachShader(this->m_id,GVar2);
  ppcVar5 = (attrs->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((attrs->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppcVar5) {
    uVar7 = 0;
    do {
      glBindAttribLocation(this->m_id,uVar7,ppcVar5[uVar7]);
      uVar7 = (ulong)((int)uVar7 + 1);
      ppcVar5 = (attrs->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(attrs->
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar5 >> 3));
  }
  glLinkProgram(this->m_id);
  local_34[0] = 0;
  glGetProgramiv(this->m_id,0x8b82,local_34);
  if (local_34[0] != 0) {
    iVar4 = glGetError();
    if (iVar4 == 0) {
      this->m_attributeCount =
           (int)((ulong)((long)(attrs->
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(attrs->
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
      return;
    }
    __assert_fail("glGetError() == GL_NO_ERROR",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglshaderprogram.h"
                  ,0x5e,
                  "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
                 );
  }
  glGetProgramiv(this->m_id,0x8b84,local_34);
  iVar4 = local_34[0];
  __ptr = (char *)malloc((long)local_34[0] + 1);
  local_44 = 0;
  glGetProgramInfoLog(this->m_id,iVar4,&local_44,__ptr);
  if (local_44 < local_34[0]) {
    __ptr[local_44] = '\0';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"E [",3);
    log_timestring_abi_cxx11_();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_68,local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]: ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Failed to link shader program:",0x1e)
    ;
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Vertex Shader:",0xe);
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<(poVar6,vsh);
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"FragmentShader:",0xf);
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<(poVar6,pcStack_40);
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"error: ",7);
    poVar6 = std::operator<<(poVar6,__ptr);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&local_68);
    free(__ptr);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglshaderprogram.h"
                  ,0x5b,
                  "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
                 );
  }
  __assert_fail("l < param",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglshaderprogram.h"
                ,0x54,
                "void rengine::OpenGLShaderProgram::initialize(const char *, const char *, const std::vector<const char *> &)"
               );
}

Assistant:

void initialize(const char *vsh, const char *fsh, const std::vector<const char *> &attrs)
    {
        assert(m_id == 0);

        GLuint vid = createShader(vsh, GL_VERTEX_SHADER);
        GLuint fid = createShader(fsh, GL_FRAGMENT_SHADER);
        assert(vid);
        assert(fid);

        m_id = glCreateProgram();
        glAttachShader(m_id, vid);
        glAttachShader(m_id, fid);

        for (unsigned i=0; i<attrs.size(); ++i)
            glBindAttribLocation(m_id, i, attrs.at(i));

        glLinkProgram(m_id);

        int param = 0;
        glGetProgramiv(m_id, GL_LINK_STATUS, &param);
        if (param == GL_FALSE) {
            glGetProgramiv(m_id, GL_INFO_LOG_LENGTH, &param);
            char *str = (char *) malloc(param + 1);
            int l = 0;
            glGetProgramInfoLog(m_id, param, &l, str);
            assert(l < param);
            str[l] = '\0';
            loge << "Failed to link shader program:" << std::endl
                 << "Vertex Shader:" << std::endl << vsh << std::endl
                 << "FragmentShader:" << std::endl << fsh << std::endl
                 << "error: " << str << std::endl;
            free(str);
            assert(false);
        }

        assert(glGetError() == GL_NO_ERROR);

        m_attributeCount = attrs.size();
    }